

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  double theta;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *this_01;
  context *ctx;
  bool bVar5;
  unique_ptr<double[],_std::default_delete<double[]>_> P;
  unique_ptr<double[],_std::default_delete<double[]>_> uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  rep rVar10;
  long lVar11;
  random_engine *rng;
  int iVar12;
  pnm_observer *x_optimistic;
  pnm_observer *x_pessimistic;
  int in_R9D;
  long lVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  string_view filename;
  compute_order compute;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  slv;
  pnm_observer obs;
  double local_3d8;
  undefined1 local_3c0 [24];
  pointer local_3a8;
  quadratic_cost_type<double> *local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  quadratic_cost_type<double> local_378;
  double local_358;
  double local_350;
  long local_348;
  compute_order local_340;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  local_308;
  pnm_observer local_288;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_3c0._16_8_ = __return_storage_ptr__;
  local_398 = cost_constant;
  bit_array_impl::bit_array_impl((bit_array_impl *)local_3c0,variables);
  this_01 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&local_378,(itm *)this_01,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             in_R9D);
  local_388 = (this_01->parameters).kappa_step;
  local_3a8 = (pointer)(this_01->parameters).delta;
  local_380 = (this_01->parameters).kappa_max;
  local_390 = (this_01->parameters).alpha;
  theta = (this_01->parameters).theta;
  if ((double)local_3a8 < 0.0) {
    ctx = this->m_ctx;
    local_288.m_pi_obs._0_8_ = theta;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar16._0_8_ = (FILE *)quadratic_cost_type<double>::min(&local_378,variables);
    auVar16._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = theta;
    auVar1 = vfnmadd132sd_fma(auVar16._0_16_,auVar16._0_16_,auVar1);
    local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar1._0_8_;
    local_308.super_debug_logger<false>.ofs = auVar16._0_8_;
    info<double,double,double>
              (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",(double *)&local_340,
               (double *)&local_308,(double *)&local_288);
    local_3a8 = local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_348 = (long)(this_01->parameters).w;
  local_350 = (this_01->parameters).pushing_k_factor;
  local_358 = (this_01->parameters).pushing_objective_amplifier;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::solver_inequalities_01coeff
            (&local_308,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_378,constraints);
  compute_order::compute_order(&local_340,(this_01->parameters).order,variables);
  dVar15 = (this->m_ctx->parameters).init_policy_random;
  local_288.m_pi_obs.constraints = 0;
  local_288.m_pi_obs._4_4_ = 0;
  local_288.m_pi_obs.m_pnm.m_buffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  iVar4 = (this_01->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_3c0,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (pnm_observer *)local_3c0;
      x_optimistic = &local_288;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_003e38bd;
      rng = this->m_rng;
      x_pessimistic = &local_288;
      x_optimistic = (pnm_observer *)local_3c0;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_003e38bd:
  local_3a0 = original_costs;
  if (local_3c0._0_4_ != 0) {
    iVar12 = 0;
    do {
      dVar14 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar14 < dVar15) {
        bit_array_impl::invert((bit_array_impl *)local_3c0,iVar12);
      }
      iVar12 = iVar12 + 1;
    } while (local_3c0._0_4_ != iVar12);
  }
  if (local_288.m_pi_obs.m_pnm.m_buffer._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    operator_delete__((void *)local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_3d8 = (this_01->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  pnm_observer::pnm_observer
            (&local_288,filename,local_308.m,local_308.n,(this_01->parameters).limit);
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar10;
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar10;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
            (&local_340,&local_308,(bit_array *)local_3c0);
  if ((this_01->parameters).limit != 0) {
    iVar12 = 0x7fffffff;
    lVar13 = 0;
    while( true ) {
      iVar7 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                        (&local_340,&local_308,(bit_array *)local_3c0,this->m_rng,local_3d8,
                         (double)local_3a8,theta);
      uVar6._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_308.pi;
      P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_308.P;
      details::pi_pnm_observer::make_observation<double>
                (&local_288.m_pi_obs,&local_308.ap,
                 (double *)
                 local_308.P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 local_308.pi._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      details::ap_pnm_observer::make_observation<double>
                (&local_288.m_ap_obs,&local_308.ap,
                 (double *)
                 P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 uVar6._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      if (iVar7 == 0) {
        dVar15 = quadratic_cost_type<double>::results(local_3a0,(bit_array *)local_3c0,local_398);
        store_if_better(this,(bit_array *)local_3c0,dVar15,lVar13);
        if ((this_01->parameters).pushes_limit < 1) goto LAB_003e3ad0;
        iVar12 = 0;
        iVar7 = 0;
        goto LAB_003e3c4c;
      }
      if (iVar7 < iVar12) {
        store_if_better(this,(bit_array *)local_3c0,iVar7,lVar13);
        iVar12 = iVar7;
      }
      if (local_348 < lVar13) {
        auVar17._0_8_ = pow((double)iVar7 / (double)local_308.m,local_390);
        auVar17._8_56_ = extraout_var_00;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_3d8;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_388;
        auVar1 = vfmadd231sd_fma(auVar19,auVar17._0_16_,auVar2);
        local_3d8 = auVar1._0_8_;
      }
      if (local_380 < local_3d8) break;
      lVar11 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar11;
      dVar15 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar15) && (dVar15 < (double)(lVar11 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar13 = lVar13 + 1, lVar13 == (this_01->parameters).limit)) break;
    }
  }
  *(result_status *)(local_3c0._16_8_ + 0xa0) = limit_reached;
LAB_003e3ad0:
  if ((this->m_best).remaining_constraints == 0) {
    *(result_status *)(local_3c0._16_8_ + 0xa0) = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    this_00 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
              (local_3c0._16_8_ + 0x68);
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
               )._M_impl.super__Vector_impl_data._M_start,variables);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_ap_obs.m_basename._M_dataplus._M_p != &local_288.m_ap_obs.m_basename.field_2) {
    operator_delete(local_288.m_ap_obs.m_basename._M_dataplus._M_p,
                    local_288.m_ap_obs.m_basename.field_2._M_allocated_capacity + 1);
  }
  pnm_vector::~pnm_vector(&local_288.m_pi_obs.m_pnm);
  if (local_340.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::~solver_inequalities_01coeff(&local_308);
  if ((_Head_base<0UL,_int_*,_false>)
      local_378.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_378.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_378.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if (local_378.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
      != (__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0) {
    operator_delete__((void *)local_378.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_378.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0;
  if (local_378.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_378.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)local_3c0._8_8_ !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_3c0._8_8_);
  }
  return (result *)local_3c0._16_8_;
LAB_003e3c4c:
  do {
    iVar8 = compute_order::
            push_and_run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                      (&local_340,&local_308,(bit_array *)local_3c0,this->m_rng,
                       local_3d8 * local_350,(double)local_3a8,theta,local_358);
    if (iVar8 == 0) {
      dVar15 = quadratic_cost_type<double>::results(local_3a0,(bit_array *)local_3c0,local_398);
      store_if_better(this,(bit_array *)local_3c0,dVar15,
                      (long)~((this_01->parameters).pushing_iteration_limit * iVar7));
    }
    lVar13 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar13;
    dVar15 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar15) && (dVar15 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (this_01->parameters).pushing_iteration_limit) {
      iVar8 = 1;
      while (iVar9 = compute_order::
                     run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                               (&local_340,&local_308,(bit_array *)local_3c0,this->m_rng,local_3d8,
                                (double)local_3a8,theta), iVar9 != 0) {
        if ((this_01->parameters).w < (double)(iVar8 + -1)) {
          auVar18._0_8_ = pow((double)iVar9 / (double)local_308.m,local_390);
          auVar18._8_56_ = extraout_var_01;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_3d8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_388;
          auVar1 = vfmadd231sd_fma(auVar20,auVar18._0_16_,auVar3);
          local_3d8 = auVar1._0_8_;
        }
        if (local_380 < local_3d8) goto LAB_003e3e33;
        lVar13 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar13;
        dVar15 = (this->m_ctx->parameters).time_limit;
        if (((0.0 < dVar15) && (dVar15 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0))
           || (bVar5 = (this_01->parameters).pushing_iteration_limit <= iVar8, iVar8 = iVar8 + 1,
              bVar5)) goto LAB_003e3e33;
      }
      dVar15 = quadratic_cost_type<double>::results(local_3a0,(bit_array *)local_3c0,local_398);
      store_if_better(this,(bit_array *)local_3c0,dVar15,
                      (long)((this_01->parameters).pushing_iteration_limit * iVar12 - iVar8));
    }
LAB_003e3e33:
    iVar7 = iVar7 + 1;
    iVar12 = iVar12 + -1;
  } while (iVar7 < (this_01->parameters).pushes_limit);
  goto LAB_003e3ad0;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }